

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O1

void storeRGBFromARGB32PM<(QImage::Format)13,false>
               (uchar *dest,uint *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *dither)

{
  uint uVar1;
  uchar *puVar2;
  ulong uVar3;
  uint uVar4;
  
  if (0 < count) {
    puVar2 = dest + (long)index * 3 + 2;
    uVar3 = 0;
    do {
      uVar4 = src[uVar3];
      if (uVar4 >> 0x18 != 0xff) {
        if (uVar4 >> 0x18 == 0) {
          uVar4 = 0;
        }
        else {
          uVar1 = qt_inv_premul_factor[uVar4 >> 0x18];
          uVar4 = (uVar4 & 0xff) * uVar1 + 0x8000 >> 0x10 & 0xff |
                  (uVar4 >> 8 & 0xff) * uVar1 + 0x8000 >> 8 & 0xff00 |
                  (uVar4 >> 0x10 & 0xff) * uVar1 + 0x8000 & 0xff0000;
        }
      }
      puVar2[-2] = (uchar)(uVar4 >> 0x10);
      puVar2[-1] = (uchar)(uVar4 >> 8);
      *puVar2 = (uchar)uVar4;
      uVar3 = uVar3 + 1;
      puVar2 = puVar2 + 3;
    } while ((uint)count != uVar3);
  }
  return;
}

Assistant:

static void QT_FASTCALL storeRGBFromARGB32PM(uchar *dest, const uint *src, int index, int count,
                                             const QList<QRgb> *, QDitherInfo *dither)
{
    constexpr uchar rWidth = redWidth<Format>();
    constexpr uchar gWidth = greenWidth<Format>();
    constexpr uchar bWidth = blueWidth<Format>();
    constexpr QPixelLayout::BPP BPP = bitsPerPixel<Format>();

    // RGB32 -> RGB888 is not a precision loss.
    if (!dither || (rWidth == 8 && gWidth == 8 && bWidth == 8)) {
        constexpr uint rMask = (1 << redWidth<Format>()) - 1;
        constexpr uint gMask = (1 << greenWidth<Format>()) - 1;
        constexpr uint bMask = (1 << blueWidth<Format>()) - 1;
        constexpr uchar rRightShift = 24 - redWidth<Format>();
        constexpr uchar gRightShift = 16 - greenWidth<Format>();
        constexpr uchar bRightShift =  8 - blueWidth<Format>();

        for (int i = 0; i < count; ++i) {
            const uint c = fromRGB ? src[i] : qUnpremultiply(src[i]);
            const uint r = ((c >> rRightShift) & rMask) << redShift<Format>();
            const uint g = ((c >> gRightShift) & gMask) << greenShift<Format>();
            const uint b = ((c >> bRightShift) & bMask) << blueShift<Format>();
            storePixel<BPP>(dest, index + i, r | g | b);
        };
    } else {
        // We do ordered dither by using a rounding conversion, but instead of
        // adding half of input precision, we add the adjusted result from the
        // bayer matrix before narrowing.
        // Note: Rounding conversion in itself is different from the naive
        // conversion we do above for non-dithering.
        const uint *bayer_line = qt_bayer_matrix[dither->y & 15];
        for (int i = 0; i < count; ++i) {
            const uint c = fromRGB ? src[i] : qUnpremultiply(src[i]);
            const int d = bayer_line[(dither->x + i) & 15];
            const int dr = d - ((d + 1) >> rWidth);
            const int dg = d - ((d + 1) >> gWidth);
            const int db = d - ((d + 1) >> bWidth);
            int r = qRed(c);
            int g = qGreen(c);
            int b = qBlue(c);
            r = (r + ((dr - r) >> rWidth) + 1) >> (8 - rWidth);
            g = (g + ((dg - g) >> gWidth) + 1) >> (8 - gWidth);
            b = (b + ((db - b) >> bWidth) + 1) >> (8 - bWidth);
            const uint s = (r << redShift<Format>())
                         | (g << greenShift<Format>())
                         | (b << blueShift<Format>());
            storePixel<BPP>(dest, index + i, s);
        }
    }
}